

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numfmt.cpp
# Opt level: O0

CurrencyAmount * __thiscall
icu_63::NumberFormat::parseCurrency(NumberFormat *this,UnicodeString *text,ParsePosition *pos)

{
  UBool UVar1;
  int32_t offset;
  int32_t iVar2;
  CurrencyAmount *this_00;
  undefined1 *size;
  CurrencyAmount *local_100;
  ConstChar16Ptr local_d8;
  undefined1 local_c9;
  CurrencyAmount *local_c8;
  LocalPointerBase<icu_63::CurrencyAmount> local_c0;
  LocalPointer<icu_63::CurrencyAmount> currAmt;
  UErrorCode ec;
  UChar curr [4];
  undefined1 local_98 [4];
  int32_t start;
  Formattable parseResult;
  ParsePosition *pos_local;
  UnicodeString *text_local;
  NumberFormat *this_local;
  
  parseResult.fBogus.fUnion._48_8_ = pos;
  Formattable::Formattable((Formattable *)local_98);
  offset = ParsePosition::getIndex((ParsePosition *)parseResult.fBogus.fUnion._48_8_);
  (*(this->super_Format).super_UObject._vptr_UObject[0x14])
            (this,text,local_98,parseResult.fBogus.fUnion._48_8_);
  iVar2 = ParsePosition::getIndex((ParsePosition *)parseResult.fBogus.fUnion._48_8_);
  if (iVar2 != offset) {
    currAmt.super_LocalPointerBase<icu_63::CurrencyAmount>.ptr._0_4_ = U_ZERO_ERROR;
    size = (undefined1 *)((long)&currAmt.super_LocalPointerBase<icu_63::CurrencyAmount>.ptr + 4);
    (*(this->super_Format).super_UObject._vptr_UObject[0x24])(this,size,&currAmt);
    UVar1 = ::U_SUCCESS((UErrorCode)currAmt.super_LocalPointerBase<icu_63::CurrencyAmount>.ptr);
    if (UVar1 != '\0') {
      this_00 = (CurrencyAmount *)UMemory::operator_new((UMemory *)0x80,(size_t)size);
      local_100 = (CurrencyAmount *)0x0;
      if (this_00 != (CurrencyAmount *)0x0) {
        local_c9 = 1;
        local_c8 = this_00;
        ConstChar16Ptr::ConstChar16Ptr
                  (&local_d8,
                   (char16_t *)
                   ((long)&currAmt.super_LocalPointerBase<icu_63::CurrencyAmount>.ptr + 4));
        CurrencyAmount::CurrencyAmount
                  (this_00,(Formattable *)local_98,&local_d8,(UErrorCode *)&currAmt);
        local_100 = this_00;
      }
      local_c9 = 0;
      LocalPointer<icu_63::CurrencyAmount>::LocalPointer
                ((LocalPointer<icu_63::CurrencyAmount> *)&local_c0,local_100,(UErrorCode *)&currAmt)
      ;
      if (this_00 != (CurrencyAmount *)0x0) {
        ConstChar16Ptr::~ConstChar16Ptr(&local_d8);
      }
      UVar1 = ::U_FAILURE((UErrorCode)currAmt.super_LocalPointerBase<icu_63::CurrencyAmount>.ptr);
      if (UVar1 == '\0') {
        this_local = (NumberFormat *)LocalPointerBase<icu_63::CurrencyAmount>::orphan(&local_c0);
      }
      else {
        ParsePosition::setIndex((ParsePosition *)parseResult.fBogus.fUnion._48_8_,offset);
      }
      LocalPointer<icu_63::CurrencyAmount>::~LocalPointer
                ((LocalPointer<icu_63::CurrencyAmount> *)&local_c0);
      if (UVar1 == '\0') goto LAB_0026fa7a;
    }
  }
  this_local = (NumberFormat *)0x0;
LAB_0026fa7a:
  Formattable::~Formattable((Formattable *)local_98);
  return (CurrencyAmount *)this_local;
}

Assistant:

CurrencyAmount* NumberFormat::parseCurrency(const UnicodeString& text,
                                            ParsePosition& pos) const {
    // Default implementation only -- subclasses should override
    Formattable parseResult;
    int32_t start = pos.getIndex();
    parse(text, parseResult, pos);
    if (pos.getIndex() != start) {
        UChar curr[4];
        UErrorCode ec = U_ZERO_ERROR;
        getEffectiveCurrency(curr, ec);
        if (U_SUCCESS(ec)) {
            LocalPointer<CurrencyAmount> currAmt(new CurrencyAmount(parseResult, curr, ec), ec);
            if (U_FAILURE(ec)) {
                pos.setIndex(start); // indicate failure
            } else {
                return currAmt.orphan();
            }
        }
    }
    return NULL;
}